

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O1

void __thiscall duckdb::StructFilter::Serialize(StructFilter *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"filter_type");
  Serializer::WriteValue<duckdb::TableFilterType>(serializer,(this->super_TableFilter).filter_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<unsigned_long>(serializer,200,"child_idx",&this->child_idx);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"child_name",&this->child_name);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
            (serializer,0xca,"child_filter",&this->child_filter);
  return;
}

Assistant:

void StructFilter::Serialize(Serializer &serializer) const {
	TableFilter::Serialize(serializer);
	serializer.WritePropertyWithDefault<idx_t>(200, "child_idx", child_idx);
	serializer.WritePropertyWithDefault<string>(201, "child_name", child_name);
	serializer.WritePropertyWithDefault<unique_ptr<TableFilter>>(202, "child_filter", child_filter);
}